

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::FboApiTestGroup::init(FboApiTestGroup *this,EVP_PKEY_CTX *ctx)

{
  _Base_ptr p_Var1;
  ContextInfo *pCVar2;
  Context *pCVar3;
  int iVar4;
  int extraout_EAX;
  iterator iVar5;
  TestNode *pTVar6;
  code *pcVar7;
  _Iter in_R8;
  code *pcVar8;
  insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  key_type local_80;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  p_Var1 = (_Base_ptr)(local_60 + 8);
  local_60._8_4_ = _S_red;
  local_60._16_8_ = 0;
  local_38 = 0;
  pCVar2 = ((this->super_TestCaseGroup).m_context)->m_contextInfo;
  __result.iter._M_node = in_R8._M_node;
  __result.container =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)p_Var1;
  local_60._24_8_ = p_Var1;
  local_40 = p_Var1;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string_const*,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
            ((__copy_move<false,false,std::random_access_iterator_tag> *)
             (pCVar2->m_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pCVar2->m_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,__result)
  ;
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"GL_OES_fbo_render_mipmap","")
  ;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"valid_tex2d_attachments",
             "Valid 2D texture attachments");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)validTex2DAttachmentsTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"valid_texcube_attachments",
             "Valid cubemap attachments");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)validTexCubeAttachmentsTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"valid_rbo_attachments",
             "Valid renderbuffer attachments");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)validRboAttachmentsTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"attach_to_default_fbo",
             "Invalid usage: attaching to default FBO");
  pcVar7 = attachToDefaultFramebufferTest;
  pcVar8 = notSupportedTest;
  if (iVar4 != 0) {
    pcVar7 = notSupportedTest;
  }
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)pcVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"invalid_tex2d_attachments",
             "Invalid 2D texture attachments");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)invalidTex2DAttachmentTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"invalid_texcube_attachments",
             "Invalid cubemap attachments");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)invalidTexCubeAttachmentTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"invalid_rbo_attachments",
             "Invalid renderbuffer attachments");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)invalidRboAttachmentTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"attach_names",
             "Attach allocated names without objects");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)attachNamesTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"texture_levels",
             "Valid and invalid texturel levels");
  pcVar7 = textureLevelsWithRenderToMipmapTest;
  if (iVar5._M_node == p_Var1) {
    pcVar7 = textureLevelsTest;
  }
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)pcVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"attachment_query_default_fbo",
             "Query attachments from default FBO");
  if (iVar4 == 0) {
    pcVar8 = attachmentQueryDefaultFboTest;
  }
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)pcVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"attachment_query_empty_fbo",
             "Query attachments from empty FBO");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)attachmentQueryEmptyFboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"attachment_query_tex2d",
             "Query 2d texture attachment properties");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)attachmentQueryTex2DTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"attachment_query_texcube",
             "Query cubemap attachment properties");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)attachmentQueryTexCubeTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"attachment_query_rbo",
             "Query renderbuffer attachment properties");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)attachmentQueryRboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"delete_tex_2d_attached_to_bound_fbo",
             "Delete 2d texture attached to currently bound FBO");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)deleteTex2DAttachedToBoundFboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"delete_tex_cube_attached_to_bound_fbo",
             "Delete cubemap attached to currently bound FBO");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)deleteTexCubeAttachedToBoundFboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"delete_rbo_attached_to_bound_fbo",
             "Delete renderbuffer attached to currently bound FBO");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)deleteRboAttachedToBoundFboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"delete_tex_2d_attached_to_not_bound_fbo",
             "Delete 2d texture attached to FBO");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)deleteTex2DAttachedToNotBoundFboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"delete_tex_cube_attached_to_not_bound_fbo",
             "Delete cubemap attached to FBO");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)deleteTexCubeAttachedToNotBoundFboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar3->m_testCtx,"delete_rbo_attached_to_not_bound_fbo",
             "Delete renderbuffer attached to FBO");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__FboApiCase_021284b0;
  pTVar6[1].m_testCtx = (TestContext *)deleteRboAttachedToNotBoundFboTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  return extraout_EAX;
}

Assistant:

void FboApiTestGroup::init (void)
{
	std::set<std::string> extensions;
	std::copy(m_context.getContextInfo().getExtensions().begin(), m_context.getContextInfo().getExtensions().end(), std::inserter(extensions, extensions.begin()));

	bool	defaultFboIsZero	= m_context.getRenderContext().getDefaultFramebuffer() == 0;
	bool	hasRenderToMipmap	= extensions.find("GL_OES_fbo_render_mipmap") != extensions.end();

	// Valid attachments
	addChild(new FboApiCase(m_context, "valid_tex2d_attachments",					"Valid 2D texture attachments",							validTex2DAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_texcube_attachments",					"Valid cubemap attachments",							validTexCubeAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_rbo_attachments",						"Valid renderbuffer attachments",						validRboAttachmentsTest));

	// Invalid attachments
	addChild(new FboApiCase(m_context, "attach_to_default_fbo",						"Invalid usage: attaching to default FBO",				defaultFboIsZero ? attachToDefaultFramebufferTest : notSupportedTest));
	addChild(new FboApiCase(m_context, "invalid_tex2d_attachments",					"Invalid 2D texture attachments",						invalidTex2DAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_texcube_attachments",				"Invalid cubemap attachments",							invalidTexCubeAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_rbo_attachments",					"Invalid renderbuffer attachments",						invalidRboAttachmentTest));
	addChild(new FboApiCase(m_context, "attach_names",								"Attach allocated names without objects",				attachNamesTest));

	addChild(new FboApiCase(m_context, "texture_levels",							"Valid and invalid texturel levels",					hasRenderToMipmap ? textureLevelsWithRenderToMipmapTest : textureLevelsTest));

	// Attachment queries
	addChild(new FboApiCase(m_context, "attachment_query_default_fbo",				"Query attachments from default FBO",					defaultFboIsZero ? attachmentQueryDefaultFboTest : notSupportedTest));
	addChild(new FboApiCase(m_context, "attachment_query_empty_fbo",				"Query attachments from empty FBO",						attachmentQueryEmptyFboTest));
	addChild(new FboApiCase(m_context, "attachment_query_tex2d",					"Query 2d texture attachment properties",				attachmentQueryTex2DTest));
	addChild(new FboApiCase(m_context, "attachment_query_texcube",					"Query cubemap attachment properties",					attachmentQueryTexCubeTest));
	addChild(new FboApiCase(m_context, "attachment_query_rbo",						"Query renderbuffer attachment properties",				attachmentQueryRboTest));

	// Delete attachments
	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_bound_fbo",		"Delete 2d texture attached to currently bound FBO",	deleteTex2DAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_bound_fbo",		"Delete cubemap attached to currently bound FBO",		deleteTexCubeAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_bound_fbo",			"Delete renderbuffer attached to currently bound FBO",	deleteRboAttachedToBoundFboTest));

	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_not_bound_fbo",	"Delete 2d texture attached to FBO",					deleteTex2DAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_not_bound_fbo",	"Delete cubemap attached to FBO",						deleteTexCubeAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_not_bound_fbo",		"Delete renderbuffer attached to FBO",					deleteRboAttachedToNotBoundFboTest));
}